

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O2

string * fs_stem_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  path pStack_98;
  path local_70;
  path local_48;
  string_view path_local;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&path_local,auto_format);
  std::filesystem::__cxx11::path::filename(&pStack_98,&local_48);
  std::filesystem::__cxx11::path::stem(&local_70,&pStack_98);
  std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&pStack_98);
  std::filesystem::__cxx11::path::~path(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_stem(std::string_view path)
{
#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).filename().stem().generic_string();
#else
  std::string r = fs_file_name(path);
  // handle special case a/..
  if (r == "..")
    return r;

  // find last dot
  std::string::size_type i = r.find_last_of('.');

  return (i != std::string::npos && i != 0)
    ? r.substr(0, i)
    : r;
#endif
}